

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::handleIncomplete(RunContext *this,AssertionInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  size_t sVar6;
  size_type sVar7;
  AssertionResultData data;
  AssertionResult assertionResult;
  AssertionResultData local_108;
  AssertionResult local_b0;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar3 = (info->macroName).m_start;
  sVar4 = (info->macroName).m_size;
  pcVar5 = (info->lineInfo).file;
  sVar6 = (info->lineInfo).line;
  sVar7 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar7;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar5;
  (this->m_lastAssertionInfo).lineInfo.line = sVar6;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar3;
  (this->m_lastAssertionInfo).macroName.m_size = sVar4;
  paVar1 = &local_108.message.field_2;
  local_108.message._M_string_length = 0;
  local_108.message.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_108.reconstructedExpression.field_2;
  local_108.reconstructedExpression._M_string_length = 0;
  local_108.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_108.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_108.lazyExpression.m_isNegated = false;
  local_108.resultType = ThrewException;
  local_108.message._M_dataplus._M_p = (pointer)paVar1;
  local_108.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,0,0,
             "Exception translation was disabled by CATCH_CONFIG_FAST_COMPILE",0x3f);
  AssertionResult::AssertionResult(&local_b0,info,&local_108);
  assertionEnded(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_b0.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_b0.m_resultData.reconstructedExpression._M_dataplus._M_p,
                    local_b0.m_resultData.reconstructedExpression.field_2._M_allocated_capacity + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_resultData.message._M_dataplus._M_p != &local_b0.m_resultData.message.field_2) {
    operator_delete(local_b0.m_resultData.message._M_dataplus._M_p,
                    local_b0.m_resultData.message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.reconstructedExpression._M_dataplus._M_p != paVar2) {
    operator_delete(local_108.reconstructedExpression._M_dataplus._M_p,
                    CONCAT71(local_108.reconstructedExpression.field_2._M_allocated_capacity._1_7_,
                             local_108.reconstructedExpression.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.message._M_dataplus._M_p,
                    CONCAT71(local_108.message.field_2._M_allocated_capacity._1_7_,
                             local_108.message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RunContext::handleIncomplete(
            AssertionInfo const& info
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = "Exception translation was disabled by CATCH_CONFIG_FAST_COMPILE";
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
    }